

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_pcm_frames(drwav *pWav,drwav_uint64 framesToRead,void *pBufferOut)

{
  drwav_uint16 dVar1;
  drwav_uint32 dVar2;
  size_t sVar3;
  long in_RDX;
  long in_RSI;
  drwav *in_RDI;
  size_t bytesRead;
  drwav_uint32 bytesPerFrame;
  void *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  drwav *in_stack_ffffffffffffffc8;
  ulong local_10;
  
  if (((in_RDI == (drwav *)0x0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_10 = 0;
  }
  else {
    dVar1 = in_RDI->translatedFormatTag;
    uVar4 = dVar1 == 2 || dVar1 == 0x11;
    if (dVar1 == 2 || dVar1 == 0x11) {
      local_10 = 0;
    }
    else {
      dVar2 = drwav_get_bytes_per_pcm_frame(in_RDI);
      if (dVar2 == 0) {
        local_10 = 0;
      }
      else {
        sVar3 = drwav_read_raw(in_stack_ffffffffffffffc8,CONCAT17(uVar4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8);
        local_10 = sVar3 / dVar2;
      }
    }
  }
  return local_10;
}

Assistant:

drwav_uint64 drwav_read_pcm_frames(drwav* pWav, drwav_uint64 framesToRead, void* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0 || pBufferOut == NULL) {
        return 0;
    }

    // Cannot use this function for compressed formats.
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        return 0;
    }

    drwav_uint32 bytesPerFrame = drwav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }

    // Don't try to read more samples than can potentially fit in the output buffer.
    if (framesToRead * bytesPerFrame > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / bytesPerFrame;
    }

    size_t bytesRead = drwav_read_raw(pWav, (size_t)(framesToRead * bytesPerFrame), pBufferOut);
    return bytesRead / bytesPerFrame;
}